

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privparent.c
# Opt level: O1

void privop_pasv_listen(session_t *sess)

{
  uint __fd;
  int iVar1;
  ulong uVar2;
  socklen_t sa_in_len;
  sockaddr_in sa_in;
  char local_ip [16];
  socklen_t local_3c;
  sockaddr local_38;
  char local_28 [24];
  
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  getlocalip(local_28);
  __fd = tcp_server(local_28,0);
  sess->pasv_listen_fd = __fd;
  local_3c = 0x10;
  uVar2 = (ulong)__fd;
  iVar1 = getsockname(__fd,&local_38,&local_3c);
  if (-1 < iVar1) {
    priv_sock_send_int(sess->parent_fd,
                       (uint)(ushort)(local_38.sa_data._0_2_ << 8 |
                                     (ushort)local_38.sa_data._0_2_ >> 8));
    return;
  }
  privop_pasv_listen_cold_1();
  iVar1 = accept_timeout(*(int *)(uVar2 + 0x830),(sockaddr_in *)0x0,tunable_accept_timeout);
  close(*(int *)(uVar2 + 0x830));
  *(undefined4 *)(uVar2 + 0x830) = 0xffffffff;
  if (iVar1 != -1) {
    priv_sock_send_result(*(int *)(uVar2 + 0x858),'\x01');
    priv_sock_send_fd(*(int *)(uVar2 + 0x858),iVar1);
    close(iVar1);
    return;
  }
  priv_sock_send_result(*(int *)(uVar2 + 0x858),'\x02');
  return;
}

Assistant:

void privop_pasv_listen(session_t *sess) {
  char local_ip[16] = {0};
  getlocalip(local_ip);

  sess->pasv_listen_fd = tcp_server(local_ip, 0);
  struct sockaddr_in sa_in;
  socklen_t sa_in_len = sizeof(sa_in);
  if (getsockname(sess->pasv_listen_fd, (struct sockaddr *) &sa_in, &sa_in_len) < 0) {
    ERR_EXIT("getsockname");
  }

  unsigned short port = ntohs(sa_in.sin_port);

  priv_sock_send_int(sess->parent_fd, (int) port);
}